

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_google::protobuf::OneofOptions_&> * __thiscall
testing::internal::
MatcherBaseImpl<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>>
::Apply<google::protobuf::OneofOptions_const&,0ul>
          (void *__return_storage_ptr__,tuple<google::protobuf::OneofOptions> *this)

{
  gmock_Impl<const_google::protobuf::OneofOptions_&> *this_00;
  __tuple_element_t<0UL,_tuple<OneofOptions>_> *from;
  OneofOptions local_70;
  tuple<google::protobuf::OneofOptions> *local_20;
  MatcherBaseImpl<google::protobuf::compiler::(anonymous_namespace)::EqualsProtoMatcherP<google::protobuf::OneofOptions>_>
  *this_local;
  void *local_10;
  
  local_20 = this;
  local_10 = __return_storage_ptr__;
  this_00 = (gmock_Impl<const_google::protobuf::OneofOptions_&> *)operator_new(0x58);
  from = std::get<0ul,google::protobuf::OneofOptions>(this);
  google::protobuf::OneofOptions::OneofOptions(&local_70,from);
  google::protobuf::compiler::anon_unknown_0::EqualsProtoMatcherP<google::protobuf::OneofOptions>::
  gmock_Impl<const_google::protobuf::OneofOptions_&>::gmock_Impl(this_00,&local_70);
  Matcher<const_google::protobuf::OneofOptions_&>::Matcher
            ((Matcher<const_google::protobuf::OneofOptions_&> *)__return_storage_ptr__,
             (MatcherInterface<const_google::protobuf::OneofOptions_&> *)this_00);
  google::protobuf::OneofOptions::~OneofOptions(&local_70);
  return (Matcher<const_google::protobuf::OneofOptions_&> *)__return_storage_ptr__;
}

Assistant:

::testing::Matcher<F> Apply(std::index_sequence<tuple_ids...>) const {
    return ::testing::Matcher<F>(
        new typename Derived<Ts...>::template gmock_Impl<F>(
            std::get<tuple_ids>(params_)...));
  }